

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsct(bifcxdef *bifctx,int argc)

{
  runcxdef *ctx_00;
  runsdef *prVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uchar *__dest;
  long in_RDI;
  runsdef stk2;
  runsdef stk1;
  runsdef val;
  uint dsz2;
  uint dsz1;
  uint l;
  uchar *p;
  uint siz3;
  uint siz2;
  uint siz1;
  uchar *l3;
  uchar *l2;
  uchar *l1;
  runcxdef *ctx;
  undefined8 in_stack_ffffffffffffff68;
  runcxdef *sizp;
  runcxdef *in_stack_ffffffffffffff70;
  runcxdef *ctx_01;
  runsdef local_68;
  uint local_54;
  uint local_50;
  int local_4c;
  void *local_48;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar8;
  runcxdef *in_stack_ffffffffffffffd0;
  runcxdef *prVar9;
  runcxdef *prVar10;
  void *pvVar11;
  runcxdef *ctx_02;
  void *__s1;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  ctx_00 = *(runcxdef **)(in_RDI + 8);
  prVar1 = ctx_00->runcxsp;
  ctx_00->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp != '\a') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(in_stack_ffffffffffffff70,iVar5);
  }
  ctx_01 = *(runcxdef **)&(ctx_00->runcxsp->runsv).runsvobj;
  ctx_02 = ctx_01;
  uVar2 = osrp2(ctx_01);
  prVar1 = ctx_00->runcxsp;
  ctx_00->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp != '\a') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx_01,iVar5);
  }
  sizp = *(runcxdef **)&(ctx_00->runcxsp->runsv).runsvobj;
  prVar9 = sizp;
  uVar3 = osrp2(sizp);
  uVar8 = uVar3;
  prVar10 = prVar9;
  if (uVar3 < uVar2) {
    in_stack_ffffffffffffffc4 = uVar2;
    uVar8 = uVar2;
    uVar2 = uVar3;
    in_stack_ffffffffffffffd0 = ctx_02;
    prVar10 = ctx_02;
    ctx_02 = prVar9;
  }
  if ((uint)((int)ctx_00->runcxhtop - (int)ctx_00->runcxhp) <= uVar2) {
    runhcmp(ctx_02,(uint)((ulong)prVar10 >> 0x20),(uint)prVar10,(runsdef *)in_stack_ffffffffffffffd0
            ,(runsdef *)CONCAT44(uVar2,uVar8),
            (runsdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  __dest = ctx_00->runcxhp + 2;
  __s1 = (void *)((long)&ctx_02->runcxerr + 2);
  pvVar11 = (void *)((long)&prVar10->runcxerr + 2);
  iVar4 = uVar2 - 2;
  iVar5 = uVar8 - 2;
  do {
    if (iVar4 == 0) {
      local_68.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx_00->runcxhp;
      local_68.runstyp = '\a';
      oswp2(ctx_00->runcxhp,(int)__dest - (int)ctx_00->runcxhp);
      ctx_00->runcxhp = __dest;
      runrepush(ctx_00,&local_68);
      return;
    }
    uVar6 = datsiz((dattyp)ctx_01,sizp);
    local_48 = pvVar11;
    local_4c = iVar5;
    local_50 = uVar6 + 1;
    iVar5 = local_4c;
    pvVar11 = local_48;
    while (local_4c != 0) {
      uVar6 = datsiz((dattyp)ctx_01,sizp);
      local_54 = uVar6 + 1;
      if ((local_50 == local_54) && (iVar7 = memcmp(__s1,local_48,(ulong)local_50), iVar7 == 0)) {
        memcpy(__dest,local_48,(ulong)local_50);
        __dest = __dest + local_50;
        break;
      }
      lstadv((uchar **)ctx_01,(uint *)sizp);
    }
    lstadv((uchar **)ctx_01,(uint *)sizp);
  } while( true );
}

Assistant:

void bifsct(bifcxdef *bifctx, int argc)
{
    runcxdef *ctx = bifctx->bifcxrun;
    uchar    *l1;
    uchar    *l2;
    uchar    *l3;
    uint      siz1;
    uint      siz2;
    uint      siz3;
    uchar    *p;
    uint      l;
    uint      dsz1;
    uint      dsz2;
    runsdef   val;
    runsdef   stk1, stk2;
    
    bifcntargs(bifctx, 2, argc);
    l1 = runpoplst(ctx);
    siz1 = osrp2(l1);
    l2 = runpoplst(ctx);
    siz2 = osrp2(l2);

    /* make sure the first list is smaller - if not, switch them */
    if (siz1 > siz2)
        l3 = l1, l1 = l2, l2 = l3, siz3 = siz1, siz1 = siz2, siz2 = siz3;
    
    /* size of result is at most size of smaller list (which is now siz1) */
    stk1.runstyp = stk2.runstyp = DAT_LIST;
    stk1.runsv.runsvstr = l1;
    stk2.runsv.runsvstr = l2;
    runhres2(ctx, siz1, 2, &stk1, &stk2);
    l1 = stk1.runsv.runsvstr;
    l2 = stk2.runsv.runsvstr;
    l3 = ctx->runcxhp + 2;

    /* go through list1, and copy each element that is found in list2 */
    for (l1 += 2, l2 += 2, siz1 -= 2, siz2 -= 2 ; siz1 ; lstadv(&l1, &siz1))
    {
        dsz1 = datsiz(*l1, l1 + 1) + 1;
        for (l = siz2, p = l2 ; l ; lstadv(&p, &l))
        {
            dsz2 = datsiz(*p, p + 1) + 1;
#ifndef AMIGA
            if (dsz1 == dsz2 && !memcmp(l1, p, (size_t)dsz1))
#else /* AMIGA */
            if (!memcmp(l1, p, (size_t)dsz1) && (dsz1 == dsz2) )
#endif /* AMIGA */
            {
                memcpy(l3, p, (size_t)dsz1);
                l3 += dsz1;
                break;
            }
        }
    }
    
    /* set up return value, take it out of the heap, and push value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_LIST;
    oswp2(ctx->runcxhp, (uint)(l3 - ctx->runcxhp));
    ctx->runcxhp = l3;
    runrepush(ctx, &val);
}